

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O1

void UpdateModel(CPpmd8 *p)

{
  uint *puVar1;
  byte bVar2;
  byte bVar3;
  Byte BVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  ushort uVar8;
  Byte *pBVar9;
  CPpmd8_Context *pCVar10;
  UInt16 UVar11;
  Byte BVar12;
  Byte BVar13;
  UInt16 UVar14;
  byte bVar15;
  UInt16 UVar16;
  uint uVar17;
  CTX_PTR pCVar18;
  void *pvVar19;
  undefined4 *puVar20;
  short sVar21;
  ulong uVar22;
  Byte *pBVar23;
  uint uVar24;
  short sVar25;
  CPpmd8_Context *c;
  uint uVar26;
  CTX_PTR c1;
  CPpmd_State *pCVar28;
  CPpmd_State *pCVar29;
  CPpmd_State tmp;
  uint local_5c;
  long lVar27;
  
  pCVar29 = p->FoundState;
  local_5c._0_2_ = pCVar29->SuccessorLow;
  local_5c._2_2_ = pCVar29->SuccessorHigh;
  bVar2 = pCVar29->Freq;
  bVar3 = pCVar29->Symbol;
  if ((bVar2 < 0x1f) && (uVar22 = (ulong)p->MinContext->Suffix, uVar22 != 0)) {
    pBVar9 = p->Base;
    if (pBVar9[uVar22] == '\0') {
      pCVar29 = (CPpmd_State *)(pBVar9 + uVar22 + 2);
      if (pBVar9[uVar22 + 3] < 0x20) {
        pBVar9[uVar22 + 3] = pBVar9[uVar22 + 3] + 1;
      }
    }
    else {
      pCVar29 = (CPpmd_State *)(pBVar9 + *(uint *)(pBVar9 + uVar22 + 4));
      if (pBVar9[*(uint *)(pBVar9 + uVar22 + 4)] != bVar3) {
        do {
          pCVar28 = pCVar29;
          pCVar29 = pCVar28 + 1;
        } while (pCVar28[1].Symbol != bVar3);
        if (pCVar28->Freq <= pCVar28[1].Freq) {
          UVar16 = pCVar28[1].SuccessorHigh;
          BVar12 = pCVar29->Symbol;
          BVar13 = pCVar29->Freq;
          UVar14 = pCVar29->SuccessorLow;
          pCVar28[1].SuccessorHigh = pCVar28->SuccessorHigh;
          BVar4 = pCVar28->Freq;
          UVar11 = pCVar28->SuccessorLow;
          pCVar29->Symbol = pCVar28->Symbol;
          pCVar29->Freq = BVar4;
          pCVar29->SuccessorLow = UVar11;
          pCVar28->SuccessorHigh = UVar16;
          pCVar28->Symbol = BVar12;
          pCVar28->Freq = BVar13;
          pCVar28->SuccessorLow = UVar14;
          pCVar29 = pCVar28;
        }
      }
      if (pCVar29->Freq < 0x73) {
        pCVar29->Freq = pCVar29->Freq + 2;
        *(short *)(pBVar9 + uVar22 + 2) = *(short *)(pBVar9 + uVar22 + 2) + 2;
      }
    }
  }
  else {
    pCVar29 = (CPpmd_State *)0x0;
  }
  c1 = p->MaxContext;
  if ((p->OrderFall == 0) && (local_5c != 0)) {
    pCVar18 = CreateSuccessors(p,1,pCVar29,p->MinContext);
    pCVar29 = p->FoundState;
    if (pCVar18 == (CTX_PTR)0x0) {
      pCVar29->SuccessorLow = 0;
      pCVar29->SuccessorHigh = 0;
LAB_0018972a:
      RestoreModel(p,c1);
      return;
    }
    *(int *)&pCVar29->SuccessorLow = (int)pCVar18 - *(int *)&p->Base;
  }
  else {
    pBVar9 = p->Text;
    BVar4 = p->FoundState->Symbol;
    p->Text = pBVar9 + 1;
    *pBVar9 = BVar4;
    if (p->UnitsStart <= p->Text) goto LAB_0018972a;
    pBVar9 = p->Base;
    lVar27 = (long)p->Text - (long)pBVar9;
    uVar26 = (uint)lVar27;
    if (local_5c == 0) {
      pCVar10 = p->MinContext;
      pCVar28 = p->FoundState;
      pCVar28->SuccessorLow = (short)uVar26;
      pCVar28->SuccessorHigh = (short)(uVar26 >> 0x10);
      uVar17 = p->OrderFall;
      c = pCVar10;
      while( true ) {
        uVar17 = uVar17 + 1;
        uVar22 = (ulong)c->Suffix;
        if (pCVar29 == (CPpmd_State *)0x0) {
          if (uVar22 == 0) {
            p->OrderFall = uVar17;
            goto LAB_001898c3;
          }
          if (pBVar9[uVar22] == '\0') {
            pCVar29 = (CPpmd_State *)(pBVar9 + uVar22 + 2);
            pBVar9[uVar22 + 3] = pBVar9[uVar22 + 3] + (pBVar9[uVar22 + 3] < 0x20);
          }
          else {
            BVar4 = pBVar9[*(uint *)(pBVar9 + uVar22 + 4)];
            pCVar29 = (CPpmd_State *)(pBVar9 + *(uint *)(pBVar9 + uVar22 + 4));
            while (BVar4 != pCVar28->Symbol) {
              BVar4 = pCVar29[1].Symbol;
              pCVar29 = pCVar29 + 1;
            }
            if (pCVar29->Freq < 0x73) {
              pCVar29->Freq = pCVar29->Freq + 2;
              *(short *)(pBVar9 + uVar22 + 2) = *(short *)(pBVar9 + uVar22 + 2) + 2;
            }
          }
        }
        c = (CPpmd8_Context *)(pBVar9 + uVar22);
        uVar24._0_2_ = pCVar29->SuccessorLow;
        uVar24._2_2_ = pCVar29->SuccessorHigh;
        if (uVar24 != 0) break;
        pCVar29->SuccessorLow = (UInt16)lVar27;
        pCVar29->SuccessorHigh = (UInt16)((ulong)lVar27 >> 0x10);
        pCVar29 = (CPpmd_State *)0x0;
      }
      p->OrderFall = uVar17;
      if (uVar24 <= uVar26) {
        p->FoundState = pCVar29;
        pCVar18 = CreateSuccessors(p,0,(CPpmd_State *)0x0,c);
        if (pCVar18 == (CTX_PTR)0x0) {
          pCVar29->SuccessorLow = 0;
          UVar16 = 0;
        }
        else {
          lVar27 = (long)pCVar18 - (long)p->Base;
          pCVar29->SuccessorLow = (UInt16)lVar27;
          UVar16 = (UInt16)((ulong)lVar27 >> 0x10);
        }
        pCVar29->SuccessorHigh = UVar16;
        p->FoundState = pCVar28;
      }
      if ((p->OrderFall == 1) && (p->MaxContext == pCVar10)) {
        pCVar28 = p->FoundState;
        UVar16 = pCVar29->SuccessorHigh;
        pCVar28->SuccessorLow = pCVar29->SuccessorLow;
        pCVar28->SuccessorHigh = UVar16;
        p->Text = p->Text + -1;
      }
      uVar17._0_2_ = pCVar29->SuccessorLow;
      uVar17._2_2_ = pCVar29->SuccessorHigh;
      if (uVar17 == 0) {
        c = (CPpmd8_Context *)0x0;
      }
      else {
        c = (CPpmd8_Context *)(p->Base + uVar17);
      }
LAB_001898c3:
      if (c == (CPpmd8_Context *)0x0) {
        RestoreModel(p,c1);
        return;
      }
      local_5c = (int)c - *(int *)&p->Base;
    }
    else if (pBVar9 + local_5c < p->UnitsStart) {
      pCVar18 = CreateSuccessors(p,0,pCVar29,p->MinContext);
      if (pCVar18 == (CTX_PTR)0x0) {
        RestoreModel(p,c1);
        return;
      }
      local_5c = (int)pCVar18 - *(int *)&p->Base;
    }
    puVar1 = &p->OrderFall;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      p->Text = p->Text + -(ulong)(p->MaxContext != p->MinContext);
      uVar26 = local_5c;
    }
    pCVar18 = p->MinContext;
    if (c1 != pCVar18) {
      bVar5 = pCVar18->NumStats;
      uVar7 = pCVar18->SummFreq;
      do {
        bVar6 = c1->NumStats;
        uVar22 = (ulong)bVar6;
        if (bVar6 == 0) {
          puVar20 = (undefined4 *)AllocUnits(p,0);
          if (puVar20 == (undefined4 *)0x0) {
            RestoreModel(p,c1);
          }
          else {
            *(undefined2 *)(puVar20 + 1) = *(undefined2 *)((long)&c1->Stats + 2);
            *puVar20 = *(undefined4 *)&c1->SummFreq;
            c1->Stats = (int)puVar20 - *(int *)&p->Base;
            bVar15 = *(byte *)((long)puVar20 + 1) * '\x02';
            if (0x1d < *(byte *)((long)puVar20 + 1)) {
              bVar15 = 0x78;
            }
            *(byte *)((long)puVar20 + 1) = bVar15;
            c1->SummFreq = (short)p->InitEsc + (ushort)(2 < bVar5) + (ushort)bVar15;
          }
          if (puVar20 == (undefined4 *)0x0) {
            return;
          }
        }
        else {
          if (((bVar6 & 1) != 0) &&
             (uVar17 = bVar6 + 1 >> 1, bVar15 = p->Units2Indx[uVar17 - 1],
             bVar15 != p->Units2Indx[uVar17])) {
            pvVar19 = AllocUnits(p,bVar15 + 1);
            if (pvVar19 == (void *)0x0) {
              RestoreModel(p,c1);
            }
            else {
              pBVar9 = p->Base;
              uVar17 = c1->Stats;
              pBVar23 = pBVar9 + uVar17;
              lVar27 = 0;
              do {
                *(undefined4 *)((long)pvVar19 + lVar27) = *(undefined4 *)(pBVar23 + lVar27);
                *(undefined4 *)((long)pvVar19 + lVar27 + 4) = *(undefined4 *)(pBVar23 + lVar27 + 4);
                *(undefined4 *)((long)pvVar19 + lVar27 + 8) = *(undefined4 *)(pBVar23 + lVar27 + 8);
                lVar27 = lVar27 + 0xc;
              } while (((uint)bVar6 * 2 + 2 & 0xfffffffc) * 3 != (int)lVar27);
              pBVar23[0] = 0xff;
              pBVar23[1] = 0xff;
              pBVar23[2] = 0xff;
              pBVar23[3] = 0xff;
              *(CPpmd_Void_Ref *)(pBVar23 + 4) = p->FreeList[bVar15];
              *(uint *)(pBVar23 + 8) = (uint)p->Indx2Units[bVar15];
              p->FreeList[bVar15] = uVar17;
              p->Stamps[bVar15] = p->Stamps[bVar15] + 1;
              c1->Stats = (int)pvVar19 - (int)pBVar9;
            }
            if (pvVar19 == (void *)0x0) {
              return;
            }
          }
          c1->SummFreq = c1->SummFreq + (ushort)((uint)bVar6 + (uint)bVar6 * 2 + 1 < (uint)bVar5);
        }
        uVar8 = c1->SummFreq;
        uVar17 = (uVar8 + 6) * (uint)bVar2 * 2;
        uVar24 = ((uint)uVar7 - ((uint)bVar2 + (uint)bVar5)) + (uint)uVar8;
        if (uVar17 < uVar24 * 6) {
          sVar25 = 4;
          sVar21 = ((ushort)(uVar24 < uVar17) - (ushort)(uVar17 < uVar24 * 4)) + 2;
        }
        else {
          sVar25 = (ushort)(uVar24 * 0xc < uVar17) + (ushort)(uVar24 * 9 < uVar17) +
                   (ushort)(uVar24 * 0xf < uVar17) + 4;
          sVar21 = sVar25;
        }
        c1->SummFreq = sVar25 + uVar8;
        pBVar9 = p->Base;
        uVar17 = c1->Stats;
        *(short *)(pBVar9 + uVar22 * 6 + (ulong)uVar17 + 8) = (short)uVar26;
        *(short *)(pBVar9 + uVar22 * 6 + (ulong)uVar17 + 10) = (short)(uVar26 >> 0x10);
        pBVar9[uVar22 * 6 + (ulong)uVar17 + 6] = bVar3;
        pBVar9[uVar22 * 6 + (ulong)uVar17 + 7] = (Byte)sVar21;
        c1->Flags = c1->Flags | (0x3f < bVar3) << 3;
        c1->NumStats = bVar6 + 1;
        c1 = (CTX_PTR)(pBVar9 + c1->Suffix);
      } while (c1 != p->MinContext);
    }
    pCVar18 = (CTX_PTR)(p->Base + local_5c);
    p->MinContext = pCVar18;
  }
  p->MaxContext = pCVar18;
  return;
}

Assistant:

static void UpdateModel(CPpmd7 *p)
{
  CPpmd_Void_Ref successor, fSuccessor = SUCCESSOR(p->FoundState);
  CTX_PTR c;
  unsigned s0, ns;
  
  if (p->FoundState->Freq < MAX_FREQ / 4 && p->MinContext->Suffix != 0)
  {
    c = SUFFIX(p->MinContext);
    
    if (c->NumStats == 1)
    {
      CPpmd_State *s = ONE_STATE(c);
      if (s->Freq < 32)
        s->Freq++;
    }
    else
    {
      CPpmd_State *s = STATS(c);
      if (s->Symbol != p->FoundState->Symbol)
      {
        do { s++; } while (s->Symbol != p->FoundState->Symbol);
        if (s[0].Freq >= s[-1].Freq)
        {
          SwapStates(&s[0], &s[-1]);
          s--;
        }
      }
      if (s->Freq < MAX_FREQ - 9)
      {
        s->Freq += 2;
        c->SummFreq += 2;
      }
    }
  }

  if (p->OrderFall == 0)
  {
    p->MinContext = p->MaxContext = CreateSuccessors(p, True);
    if (p->MinContext == 0)
    {
      RestartModel(p);
      return;
    }
    SetSuccessor(p->FoundState, REF(p->MinContext));
    return;
  }
  
  *p->Text++ = p->FoundState->Symbol;
  successor = REF(p->Text);
  if (p->Text >= p->UnitsStart)
  {
    RestartModel(p);
    return;
  }
  
  if (fSuccessor)
  {
    if (fSuccessor <= successor)
    {
      CTX_PTR cs = CreateSuccessors(p, False);
      if (cs == NULL)
      {
        RestartModel(p);
        return;
      }
      fSuccessor = REF(cs);
    }
    if (--p->OrderFall == 0)
    {
      successor = fSuccessor;
      p->Text -= (p->MaxContext != p->MinContext);
    }
  }
  else
  {
    SetSuccessor(p->FoundState, successor);
    fSuccessor = REF(p->MinContext);
  }
  
  s0 = p->MinContext->SummFreq - (ns = p->MinContext->NumStats) - (p->FoundState->Freq - 1);
  
  for (c = p->MaxContext; c != p->MinContext; c = SUFFIX(c))
  {
    unsigned ns1;
    UInt32 cf, sf;
    if ((ns1 = c->NumStats) != 1)
    {
      if ((ns1 & 1) == 0)
      {
        /* Expand for one UNIT */
        unsigned oldNU = ns1 >> 1;
        unsigned i = U2I(oldNU);
        if (i != U2I(oldNU + 1))
        {
          void *ptr = AllocUnits(p, i + 1);
          void *oldPtr;
          if (!ptr)
          {
            RestartModel(p);
            return;
          }
          oldPtr = STATS(c);
          MyMem12Cpy(ptr, oldPtr, oldNU);
          InsertNode(p, oldPtr, i);
          c->Stats = STATS_REF(ptr);
        }
      }
      c->SummFreq = (UInt16)(c->SummFreq + (2 * ns1 < ns) + 2 * ((4 * ns1 <= ns) & (c->SummFreq <= 8 * ns1)));
    }
    else
    {
      CPpmd_State *s = (CPpmd_State*)AllocUnits(p, 0);
      if (!s)
      {
        RestartModel(p);
        return;
      }
      *s = *ONE_STATE(c);
      c->Stats = REF(s);
      if (s->Freq < MAX_FREQ / 4 - 1)
        s->Freq <<= 1;
      else
        s->Freq = MAX_FREQ - 4;
      c->SummFreq = (UInt16)(s->Freq + p->InitEsc + (ns > 3));
    }
    cf = 2 * (UInt32)p->FoundState->Freq * (c->SummFreq + 6);
    sf = (UInt32)s0 + c->SummFreq;
    if (cf < 6 * sf)
    {
      cf = 1 + (cf > sf) + (cf >= 4 * sf);
      c->SummFreq += 3;
    }
    else
    {
      cf = 4 + (cf >= 9 * sf) + (cf >= 12 * sf) + (cf >= 15 * sf);
      c->SummFreq = (UInt16)(c->SummFreq + cf);
    }
    {
      CPpmd_State *s = STATS(c) + ns1;
      SetSuccessor(s, successor);
      s->Symbol = p->FoundState->Symbol;
      s->Freq = (Byte)cf;
      c->NumStats = (UInt16)(ns1 + 1);
    }
  }
  p->MaxContext = p->MinContext = CTX(fSuccessor);
}